

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O0

void __thiscall
helics::JsonTranslatorOperation::JsonTranslatorOperation(JsonTranslatorOperation *this)

{
  TranslatorOperations *in_RDI;
  
  TranslatorOperations::TranslatorOperations(in_RDI);
  in_RDI->_vptr_TranslatorOperations = (_func_int **)&PTR__JsonTranslatorOperation_009c3d58;
  std::make_shared<helics::JsonTranslatorOperator>();
  return;
}

Assistant:

JsonTranslatorOperation::JsonTranslatorOperation(): to(std::make_shared<JsonTranslatorOperator>())
{
}